

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined2 uVar9;
  long lVar10;
  char cVar11;
  BIT_DStream_status BVar12;
  BIT_DStream_status BVar13;
  BIT_DStream_status BVar14;
  BIT_DStream_status BVar15;
  size_t sVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  byte *srcBuffer;
  int iVar20;
  undefined1 *puVar21;
  int iVar22;
  ulong uVar23;
  undefined1 *puVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 *puStack_1a8;
  ulong *puStack_190;
  ulong uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  BIT_DStream_t BStack_170;
  BIT_DStream_t BStack_148;
  BIT_DStream_t BStack_120;
  undefined1 *puStack_f8;
  size_t sStack_e8;
  BIT_DStream_t BStack_e0;
  undefined1 *puStack_b8;
  size_t *psStack_90;
  ulong *puStack_88;
  ulong uStack_80;
  undefined1 *puStack_70;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar16 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar16;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar6 = *cSrc;
  uVar26 = (ulong)uVar6;
  uVar7 = *(ushort *)((long)cSrc + 2);
  uVar8 = *(ushort *)((long)cSrc + 4);
  uVar23 = uVar26 + uVar7 + (ulong)uVar8 + 6;
  if (cSrcSize < uVar23) {
LAB_0040ebb5:
    sVar16 = 0xffffffffffffffec;
  }
  else {
    if (uVar6 != 0) {
      BStack_120.start = (char *)((long)cSrc + 6);
      BStack_148.start = (char *)((long)cSrc + uVar26 + 6);
      uVar9 = *(undefined2 *)((long)DTable + 2);
      BStack_120.limitPtr = (char *)((long)cSrc + 0xe);
      if (uVar6 < 8) {
        BStack_120.bitContainer = (size_t)(byte)*BStack_120.start;
        switch(uVar6) {
        case 7:
          BStack_120.bitContainer =
               BStack_120.bitContainer | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
        case 6:
          BStack_120.bitContainer =
               BStack_120.bitContainer + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
        case 5:
          BStack_120.bitContainer =
               BStack_120.bitContainer + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
        case 4:
          BStack_120.bitContainer =
               BStack_120.bitContainer + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
        case 3:
          BStack_120.bitContainer =
               BStack_120.bitContainer + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
        case 2:
          BStack_120.bitContainer =
               (ulong)*(byte *)((long)cSrc + 7) * 0x100 + BStack_120.bitContainer;
        }
        bVar17 = *(byte *)((long)cSrc + uVar26 + 5);
        if (bVar17 == 0) goto LAB_0040ebb5;
        uVar19 = 0x1f;
        if (bVar17 != 0) {
          for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        BStack_120.bitsConsumed = (uVar19 ^ 0x1f) + (uint)uVar6 * -8 + 0x29;
        BStack_120.ptr = BStack_120.start;
      }
      else {
        BStack_120.bitContainer = *(ulong *)((long)cSrc + (uVar26 - 2));
        if (BStack_120.bitContainer >> 0x38 == 0) {
          return 0xffffffffffffffff;
        }
        uVar19 = 0x1f;
        bVar17 = (byte)(BStack_120.bitContainer >> 0x38);
        if (bVar17 != 0) {
          for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        BStack_120.bitsConsumed = ~uVar19 + 9;
        BStack_120.ptr = (char *)((long)cSrc + (uVar26 - 2));
      }
      if (uVar7 != 0) {
        BStack_170.start = (char *)((ulong)uVar7 + (long)BStack_148.start);
        BStack_148.limitPtr = (char *)((long)cSrc + uVar26 + 0xe);
        if (uVar7 < 8) {
          BStack_148.bitContainer = (size_t)(byte)*(ulong *)BStack_148.start;
          switch(uVar7) {
          case 7:
            BStack_148.bitContainer =
                 BStack_148.bitContainer | (ulong)*(byte *)((long)cSrc + uVar26 + 0xc) << 0x30;
          case 6:
            BStack_148.bitContainer =
                 BStack_148.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar26 + 0xb) << 0x28);
          case 5:
            BStack_148.bitContainer =
                 BStack_148.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar26 + 10) << 0x20);
          case 4:
            BStack_148.bitContainer =
                 BStack_148.bitContainer + (ulong)*(byte *)((long)cSrc + uVar26 + 9) * 0x1000000;
          case 3:
            BStack_148.bitContainer =
                 BStack_148.bitContainer + (ulong)*(byte *)((long)cSrc + uVar26 + 8) * 0x10000;
          case 2:
            BStack_148.bitContainer =
                 (ulong)*(byte *)((long)cSrc + uVar26 + 7) * 0x100 + BStack_148.bitContainer;
          }
          bVar17 = *(byte *)((long)BStack_170.start + -1);
          if (bVar17 == 0) goto LAB_0040ebb5;
          uVar19 = 0x1f;
          if (bVar17 != 0) {
            for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          BStack_148.bitsConsumed = (uVar19 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
          BStack_148.ptr = BStack_148.start;
        }
        else {
          BStack_148.bitContainer = *(ulong *)((long)BStack_170.start + -8);
          if (BStack_148.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar19 = 0x1f;
          bVar17 = (byte)(BStack_148.bitContainer >> 0x38);
          if (bVar17 != 0) {
            for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          BStack_148.bitsConsumed = ~uVar19 + 9;
          BStack_148.ptr = (char *)((long)BStack_170.start + -8);
        }
        if (uVar8 == 0) {
          return 0xffffffffffffffb8;
        }
        srcBuffer = (byte *)((ulong)uVar8 + (long)BStack_170.start);
        BStack_170.limitPtr = (char *)((long)BStack_170.start + 8);
        if (uVar8 < 8) {
          BStack_170.bitContainer = (size_t)(byte)*(ulong *)BStack_170.start;
          switch(uVar8) {
          case 7:
            BStack_170.bitContainer =
                 BStack_170.bitContainer | (ulong)*(byte *)((long)BStack_170.start + 6) << 0x30;
          case 6:
            BStack_170.bitContainer =
                 BStack_170.bitContainer + ((ulong)*(byte *)((long)BStack_170.start + 5) << 0x28);
          case 5:
            BStack_170.bitContainer =
                 BStack_170.bitContainer + ((ulong)*(byte *)((long)BStack_170.start + 4) << 0x20);
          case 4:
            BStack_170.bitContainer =
                 BStack_170.bitContainer + (ulong)*(byte *)((long)BStack_170.start + 3) * 0x1000000;
          case 3:
            BStack_170.bitContainer =
                 BStack_170.bitContainer + (ulong)*(byte *)((long)BStack_170.start + 2) * 0x10000;
          case 2:
            BStack_170.bitContainer =
                 (ulong)*(byte *)((long)BStack_170.start + 1) * 0x100 + BStack_170.bitContainer;
          }
          bVar17 = srcBuffer[-1];
          if (bVar17 == 0) goto LAB_0040ebb5;
          uVar19 = 0x1f;
          if (bVar17 != 0) {
            for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          BStack_170.bitsConsumed = (uVar19 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
          BStack_170.ptr = BStack_170.start;
        }
        else {
          BStack_170.bitContainer = *(size_t *)(srcBuffer + -8);
          if (BStack_170.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar19 = 0x1f;
          bVar17 = (byte)(BStack_170.bitContainer >> 0x38);
          if (bVar17 != 0) {
            for (; bVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
            }
          }
          BStack_170.bitsConsumed = ~uVar19 + 9;
          BStack_170.ptr = (char *)(srcBuffer + -8);
        }
        sVar16 = BIT_initDStream(&BStack_e0,srcBuffer,cSrcSize - uVar23);
        if (0xffffffffffffff88 < sVar16) {
          return sVar16;
        }
        puStack_70 = (undefined1 *)((long)dst + maxDstSize);
        uStack_80 = maxDstSize + 3 >> 2;
        puStack_f8 = (undefined1 *)((long)dst + uStack_80);
        puStack_b8 = puStack_f8 + uStack_80;
        puVar2 = puStack_b8 + uStack_80;
        BVar12 = BIT_reloadDStream(&BStack_120);
        BVar13 = BIT_reloadDStream(&BStack_148);
        BVar14 = BIT_reloadDStream(&BStack_170);
        BVar15 = BIT_reloadDStream(&BStack_e0);
        puVar1 = puStack_70 + -3;
        uStack_178 = BStack_120.bitContainer;
        uStack_180 = BStack_148.bitContainer;
        uStack_188 = BStack_170.bitContainer;
        sStack_e8 = BStack_e0.bitContainer;
        cVar11 = (char)uVar9;
        puVar21 = puStack_b8;
        puVar24 = puStack_f8;
        puStack_1a8 = puVar2;
        if ((BVar15 == BIT_DStream_unfinished &&
             (BVar14 == BIT_DStream_unfinished &&
             (BVar13 == BIT_DStream_unfinished && BVar12 == BIT_DStream_unfinished))) &&
           (puVar2 < puVar1)) {
          bVar17 = -cVar11 & 0x3f;
          puStack_88 = (ulong *)BStack_120.ptr;
          puStack_190 = (ulong *)BStack_170.ptr;
          psStack_90 = (size_t *)BStack_e0.ptr;
          lVar10 = uStack_80 * 3;
          do {
            puVar21 = (undefined1 *)dst;
            uVar26 = (uStack_178 << ((byte)BStack_120.bitsConsumed & 0x3f)) >> bVar17;
            uVar27 = (uStack_180 << ((byte)BStack_148.bitsConsumed & 0x3f)) >> bVar17;
            uVar28 = (uStack_188 << ((byte)BStack_170.bitsConsumed & 0x3f)) >> bVar17;
            uVar23 = (sStack_e8 << ((byte)BStack_e0.bitsConsumed & 0x3f)) >> bVar17;
            iVar25 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_120.bitsConsumed;
            *puVar21 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            iVar22 = *(byte *)((long)DTable + uVar27 * 2 + 5) + BStack_148.bitsConsumed;
            puVar21[uStack_80] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
            iVar18 = *(byte *)((long)DTable + uVar28 * 2 + 5) + BStack_170.bitsConsumed;
            puVar21[uStack_80 * 2] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
            uVar27 = (uStack_178 << ((byte)iVar25 & 0x3f)) >> bVar17;
            uVar26 = (uStack_180 << ((byte)iVar22 & 0x3f)) >> bVar17;
            iVar20 = *(byte *)((long)DTable + uVar23 * 2 + 5) + BStack_e0.bitsConsumed;
            uVar28 = (uStack_188 << ((byte)iVar18 & 0x3f)) >> bVar17;
            uVar29 = (sStack_e8 << ((byte)iVar20 & 0x3f)) >> bVar17;
            puVar21[lVar10] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
            iVar25 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar25;
            puVar21[1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
            iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
            puVar21[uStack_80 + 1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            iVar18 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 5) + iVar18;
            puVar21[uStack_80 * 2 + 1] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
            iVar20 = (uint)*(byte *)((long)DTable + uVar29 * 2 + 5) + iVar20;
            puVar21[lVar10 + 1] = *(undefined1 *)((long)DTable + uVar29 * 2 + 4);
            uVar23 = (uStack_178 << ((byte)iVar25 & 0x3f)) >> bVar17;
            uVar27 = (uStack_180 << ((byte)iVar22 & 0x3f)) >> bVar17;
            iVar25 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar25;
            uVar28 = (uStack_188 << ((byte)iVar18 & 0x3f)) >> bVar17;
            uVar26 = (sStack_e8 << ((byte)iVar20 & 0x3f)) >> bVar17;
            puVar21[2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
            iVar22 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar22;
            puVar21[uStack_80 + 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
            iVar18 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 5) + iVar18;
            puVar21[uStack_80 * 2 + 2] = *(undefined1 *)((long)DTable + uVar28 * 2 + 4);
            iVar20 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar20;
            puVar21[lVar10 + 2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (uStack_178 << ((byte)iVar25 & 0x3f)) >> bVar17;
            BStack_120.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar25;
            puVar21[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (uStack_180 << ((byte)iVar22 & 0x3f)) >> bVar17;
            bVar3 = *(byte *)((long)DTable + uVar26 * 2 + 5);
            puVar21[uStack_80 + 3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (uStack_188 << ((byte)iVar18 & 0x3f)) >> bVar17;
            bVar4 = *(byte *)((long)DTable + uVar26 * 2 + 5);
            puVar21[uStack_80 * 2 + 3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (sStack_e8 << ((byte)iVar20 & 0x3f)) >> bVar17;
            bVar5 = *(byte *)((long)DTable + uVar26 * 2 + 5);
            puVar21[lVar10 + 3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            if (BStack_120.bitsConsumed < 0x41) {
              if (puStack_88 < BStack_120.limitPtr) {
                if (puStack_88 == (ulong *)BStack_120.start) goto LAB_0040f3df;
                uVar19 = (int)puStack_88 - (int)BStack_120.start;
                if (BStack_120.start <=
                    (ulong *)((long)puStack_88 - (ulong)(BStack_120.bitsConsumed >> 3))) {
                  uVar19 = BStack_120.bitsConsumed >> 3;
                }
                BStack_120.bitsConsumed = BStack_120.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_120.bitsConsumed >> 3;
                BStack_120.bitsConsumed = BStack_120.bitsConsumed & 7;
              }
              puStack_88 = (ulong *)((long)puStack_88 - (ulong)uVar19);
              uStack_178 = *puStack_88;
            }
LAB_0040f3df:
            BStack_148.bitsConsumed = iVar22 + (uint)bVar3;
            if (BStack_148.bitsConsumed < 0x41) {
              if (BStack_148.ptr < BStack_148.limitPtr) {
                if (BStack_148.ptr == BStack_148.start) goto LAB_0040f451;
                uVar19 = (int)BStack_148.ptr - (int)BStack_148.start;
                if (BStack_148.start <=
                    (ulong *)((long)BStack_148.ptr - (ulong)(BStack_148.bitsConsumed >> 3))) {
                  uVar19 = BStack_148.bitsConsumed >> 3;
                }
                BStack_148.bitsConsumed = BStack_148.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_148.bitsConsumed >> 3;
                BStack_148.bitsConsumed = BStack_148.bitsConsumed & 7;
              }
              BStack_148.ptr = (char *)((long)BStack_148.ptr - (ulong)uVar19);
              uStack_180 = *(ulong *)BStack_148.ptr;
            }
LAB_0040f451:
            BStack_170.bitsConsumed = iVar18 + (uint)bVar4;
            if (BStack_170.bitsConsumed < 0x41) {
              if (puStack_190 < BStack_170.limitPtr) {
                if (puStack_190 == (ulong *)BStack_170.start) goto LAB_0040f4bd;
                uVar19 = (int)puStack_190 - (int)BStack_170.start;
                if (BStack_170.start <=
                    (ulong *)((long)puStack_190 - (ulong)(BStack_170.bitsConsumed >> 3))) {
                  uVar19 = BStack_170.bitsConsumed >> 3;
                }
                BStack_170.bitsConsumed = BStack_170.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_170.bitsConsumed >> 3;
                BStack_170.bitsConsumed = BStack_170.bitsConsumed & 7;
              }
              puStack_190 = (ulong *)((long)puStack_190 - (ulong)uVar19);
              uStack_188 = *puStack_190;
            }
LAB_0040f4bd:
            BStack_e0.bitsConsumed = iVar20 + (uint)bVar5;
            if (BStack_e0.bitsConsumed < 0x41) {
              if (psStack_90 < BStack_e0.limitPtr) {
                if (psStack_90 == (size_t *)BStack_e0.start) goto LAB_0040f53b;
                uVar19 = (int)psStack_90 - (int)BStack_e0.start;
                if (BStack_e0.start <=
                    (size_t *)((long)psStack_90 - (ulong)(BStack_e0.bitsConsumed >> 3))) {
                  uVar19 = BStack_e0.bitsConsumed >> 3;
                }
                BStack_e0.bitsConsumed = BStack_e0.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_e0.bitsConsumed >> 3;
                BStack_e0.bitsConsumed = BStack_e0.bitsConsumed & 7;
              }
              psStack_90 = (size_t *)((long)psStack_90 - (ulong)uVar19);
              sStack_e8 = *psStack_90;
            }
LAB_0040f53b:
            dst = puVar21 + 4;
          } while (puVar21 + lVar10 + 4 < puVar1);
          dst = puVar21 + 4;
          BStack_120.ptr = (char *)puStack_88;
          BStack_e0.ptr = (char *)psStack_90;
          puVar21 = (undefined1 *)((long)dst + uStack_80 * 2);
          puVar24 = (undefined1 *)((long)dst + uStack_80);
          puStack_1a8 = (undefined1 *)((long)dst + lVar10);
          BStack_170.ptr = (char *)puStack_190;
        }
        BStack_120.bitContainer = uStack_178;
        BStack_148.bitContainer = uStack_180;
        BStack_170.bitContainer = uStack_188;
        BStack_e0.bitContainer = sStack_e8;
        if ((dst <= puStack_f8) && (puVar24 <= puStack_b8)) {
          if (puVar2 < puVar21) {
            return 0xffffffffffffffec;
          }
          if (BStack_120.bitsConsumed < 0x41) {
            bVar17 = -cVar11 & 0x3f;
            do {
              if (BStack_120.ptr < BStack_120.limitPtr) {
                if (BStack_120.ptr == BStack_120.start) break;
                bVar30 = BStack_120.start <=
                         (ulong *)((long)BStack_120.ptr - (ulong)(BStack_120.bitsConsumed >> 3));
                uVar19 = (int)BStack_120.ptr - (int)BStack_120.start;
                if (bVar30) {
                  uVar19 = BStack_120.bitsConsumed >> 3;
                }
                BStack_120.bitsConsumed = BStack_120.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_120.bitsConsumed >> 3;
                BStack_120.bitsConsumed = BStack_120.bitsConsumed & 7;
                bVar30 = true;
              }
              BStack_120.ptr = (char *)((long)BStack_120.ptr - (ulong)uVar19);
              BStack_120.bitContainer = *(size_t *)BStack_120.ptr;
              if ((puStack_f8 + -3 <= dst) || (!bVar30)) break;
              uVar26 = (BStack_120.bitContainer << ((byte)BStack_120.bitsConsumed & 0x3f)) >> bVar17
              ;
              iVar22 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_120.bitsConsumed;
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_120.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_120.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_120.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              BStack_120.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              dst = (void *)((long)dst + 4);
              if (0x40 < BStack_120.bitsConsumed) break;
            } while( true );
          }
          if (dst < puStack_f8) {
            do {
              uVar26 = (BStack_120.bitContainer << ((byte)BStack_120.bitsConsumed & 0x3f)) >>
                       (-cVar11 & 0x3fU);
              BStack_120.bitsConsumed =
                   *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_120.bitsConsumed;
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              dst = (void *)((long)dst + 1);
            } while (dst < puStack_f8);
          }
          if (BStack_148.bitsConsumed < 0x41) {
            bVar17 = -cVar11 & 0x3f;
            do {
              if (BStack_148.ptr < BStack_148.limitPtr) {
                if (BStack_148.ptr == BStack_148.start) break;
                bVar30 = BStack_148.start <=
                         (ulong *)((long)BStack_148.ptr - (ulong)(BStack_148.bitsConsumed >> 3));
                uVar26 = (ulong)(uint)((int)BStack_148.ptr - (int)BStack_148.start);
                if (bVar30) {
                  uVar26 = (ulong)(BStack_148.bitsConsumed >> 3);
                }
                BStack_148.bitsConsumed = BStack_148.bitsConsumed + (int)uVar26 * -8;
              }
              else {
                uVar26 = (ulong)(BStack_148.bitsConsumed >> 3);
                BStack_148.bitsConsumed = BStack_148.bitsConsumed & 7;
                bVar30 = true;
              }
              BStack_148.ptr = (char *)((long)BStack_148.ptr - uVar26);
              BStack_148.bitContainer = *(size_t *)BStack_148.ptr;
              if ((puStack_b8 + -3 <= puVar24) || (!bVar30)) break;
              uVar26 = (BStack_148.bitContainer << ((byte)BStack_148.bitsConsumed & 0x3f)) >> bVar17
              ;
              iVar22 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_148.bitsConsumed;
              *puVar24 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_148.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar24[1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_148.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar24[2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_148.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              BStack_148.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar24[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              puVar24 = puVar24 + 4;
              if (0x40 < BStack_148.bitsConsumed) break;
            } while( true );
          }
          if (puVar24 < puStack_b8) {
            do {
              uVar26 = (BStack_148.bitContainer << ((byte)BStack_148.bitsConsumed & 0x3f)) >>
                       (-cVar11 & 0x3fU);
              BStack_148.bitsConsumed =
                   *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_148.bitsConsumed;
              *puVar24 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              puVar24 = puVar24 + 1;
            } while (puVar24 < puStack_b8);
          }
          if (BStack_170.bitsConsumed < 0x41) {
            bVar17 = -cVar11 & 0x3f;
            do {
              if (BStack_170.ptr < BStack_170.limitPtr) {
                if (BStack_170.ptr == BStack_170.start) break;
                bVar30 = BStack_170.start <=
                         (ulong *)((long)BStack_170.ptr - (ulong)(BStack_170.bitsConsumed >> 3));
                uVar19 = (int)BStack_170.ptr - (int)BStack_170.start;
                if (bVar30) {
                  uVar19 = BStack_170.bitsConsumed >> 3;
                }
                BStack_170.bitsConsumed = BStack_170.bitsConsumed + uVar19 * -8;
              }
              else {
                uVar19 = BStack_170.bitsConsumed >> 3;
                BStack_170.bitsConsumed = BStack_170.bitsConsumed & 7;
                bVar30 = true;
              }
              BStack_170.ptr = (char *)((long)BStack_170.ptr - (ulong)uVar19);
              BStack_170.bitContainer = *(size_t *)BStack_170.ptr;
              if ((puVar2 + -3 <= puVar21) || (!bVar30)) break;
              uVar26 = (BStack_170.bitContainer << ((byte)BStack_170.bitsConsumed & 0x3f)) >> bVar17
              ;
              iVar22 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_170.bitsConsumed;
              *puVar21 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_170.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar21[1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_170.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar21[2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar26 = (BStack_170.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
              BStack_170.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              puVar21[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              puVar21 = puVar21 + 4;
              if (0x40 < BStack_170.bitsConsumed) break;
            } while( true );
          }
          if (puVar21 < puVar2) {
            do {
              uVar26 = (BStack_170.bitContainer << ((byte)BStack_170.bitsConsumed & 0x3f)) >>
                       (-cVar11 & 0x3fU);
              BStack_170.bitsConsumed =
                   *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_170.bitsConsumed;
              *puVar21 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              puVar21 = puVar21 + 1;
            } while (puVar21 < puVar2);
          }
          if (0x40 < BStack_e0.bitsConsumed) {
LAB_0040fbed:
            if (puStack_1a8 < puStack_70) {
              do {
                uVar26 = (BStack_e0.bitContainer << ((byte)BStack_e0.bitsConsumed & 0x3f)) >>
                         (-cVar11 & 0x3fU);
                BStack_e0.bitsConsumed =
                     *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_e0.bitsConsumed;
                *puStack_1a8 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
                puStack_1a8 = puStack_1a8 + 1;
              } while (puStack_1a8 < puStack_70);
            }
            if (BStack_e0.bitsConsumed != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_e0.ptr != BStack_e0.start) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_170.bitsConsumed != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_170.ptr != BStack_170.start) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_148.bitsConsumed != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_148.ptr != BStack_148.start) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_120.bitsConsumed != 0x40) {
              maxDstSize = 0xffffffffffffffec;
            }
            if (BStack_120.ptr == BStack_120.start) {
              return maxDstSize;
            }
            return 0xffffffffffffffec;
          }
          bVar17 = -cVar11 & 0x3f;
          do {
            if (BStack_e0.ptr < BStack_e0.limitPtr) {
              if (BStack_e0.ptr == BStack_e0.start) goto LAB_0040fbed;
              bVar30 = BStack_e0.start <=
                       (size_t *)((long)BStack_e0.ptr - (ulong)(BStack_e0.bitsConsumed >> 3));
              uVar19 = (int)BStack_e0.ptr - (int)BStack_e0.start;
              if (bVar30) {
                uVar19 = BStack_e0.bitsConsumed >> 3;
              }
              BStack_e0.bitsConsumed = BStack_e0.bitsConsumed + uVar19 * -8;
            }
            else {
              uVar19 = BStack_e0.bitsConsumed >> 3;
              BStack_e0.bitsConsumed = BStack_e0.bitsConsumed & 7;
              bVar30 = true;
            }
            BStack_e0.ptr = (char *)((long)BStack_e0.ptr - (ulong)uVar19);
            BStack_e0.bitContainer = *(size_t *)BStack_e0.ptr;
            if ((puVar1 <= puStack_1a8) || (!bVar30)) goto LAB_0040fbed;
            uVar26 = (BStack_e0.bitContainer << ((byte)BStack_e0.bitsConsumed & 0x3f)) >> bVar17;
            iVar22 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_e0.bitsConsumed;
            *puStack_1a8 = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (BStack_e0.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
            iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
            puStack_1a8[1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (BStack_e0.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
            iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
            puStack_1a8[2] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            uVar26 = (BStack_e0.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar17;
            BStack_e0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
            puStack_1a8[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
            puStack_1a8 = puStack_1a8 + 4;
            if (0x40 < BStack_e0.bitsConsumed) goto LAB_0040fbed;
          } while( true );
        }
        goto LAB_0040ebb5;
      }
    }
    sVar16 = 0xffffffffffffffb8;
  }
  return sVar16;
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}